

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpixeltransferoptions.cpp
# Opt level: O3

void __thiscall
QOpenGLPixelTransferOptions::setSkipImages(QOpenGLPixelTransferOptions *this,int skipImages)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  
  pQVar1 = (this->data).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QOpenGLPixelTransferOptionsData>::detach_helper(&this->data);
    pQVar1 = (this->data).d.ptr;
  }
  pQVar1->skipImages = skipImages;
  return;
}

Assistant:

void QOpenGLPixelTransferOptions::setSkipImages(int skipImages)
{
    data->skipImages = skipImages;
}